

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1f98d97::EntriesProcessing::IncludeEntry
          (EntriesProcessing *this,LinkEntry *entry)

{
  TargetType TVar1;
  UnicityKind UVar2;
  bool bVar3;
  
  UVar2 = this->Unicity;
  if (UVar2 == None) {
    return true;
  }
  if (UVar2 == Shared) {
    if (entry->Target == (cmGeneratorTarget *)0x0) {
      return true;
    }
    TVar1 = cmGeneratorTarget::GetType(entry->Target);
    if (TVar1 != SHARED_LIBRARY) {
      return true;
    }
    UVar2 = this->Unicity;
  }
  if (UVar2 == All) {
    bVar3 = entry->Kind != Library;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool IncludeEntry(LinkEntry const& entry) const
  {
    return this->Unicity == None ||
      (this->Unicity == Shared &&
       (entry.Target == nullptr ||
        entry.Target->GetType() != cmStateEnums::SHARED_LIBRARY)) ||
      (this->Unicity == All && entry.Kind != LinkEntry::Library);
  }